

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

bool __thiscall duckdb::Node::MergePrefixes(Node *this,ART *art,Node *other,GateStatus status)

{
  ulong uVar1;
  bool bVar2;
  Node __tmp;
  ART *pAVar3;
  idx_t pos;
  reference<Node> l_node;
  reference<Node> r_node;
  idx_t local_40;
  reference<Node> local_38;
  reference<Node> local_30;
  
  local_40 = 0xffffffffffffffff;
  uVar1 = (this->super_IndexPointer).data;
  local_38._M_data = this;
  local_30._M_data = other;
  if ((uVar1 & 0x7f00000000000000) == 0x100000000000000) {
    if (((other->super_IndexPointer).data & 0x7f00000000000000) == 0x100000000000000) {
      pAVar3 = art;
      bVar2 = Prefix::Traverse(art,&local_38,&local_30,&local_40,status);
      if (!bVar2) {
        return false;
      }
      this = (Node *)pAVar3;
      if (local_40 == 0xffffffffffffffff) {
        return true;
      }
      goto LAB_0170dce6;
    }
    (this->super_IndexPointer).data = (other->super_IndexPointer).data;
    (other->super_IndexPointer).data = uVar1;
  }
  local_40 = 0;
LAB_0170dce6:
  if (((((local_38._M_data)->super_IndexPointer).data & 0x7f00000000000000) != 0x100000000000000) &&
     (((other->super_IndexPointer).data & 0x7f00000000000000) == 0x100000000000000)) {
    bVar2 = PrefixContainsOther(this,art,local_38._M_data,other,(uint8_t)local_40,status);
    return bVar2;
  }
  MergeIntoNode4(this,art,local_38._M_data,other,(uint8_t)local_40);
  return true;
}

Assistant:

bool Node::MergePrefixes(ART &art, Node &other, const GateStatus status) {
	reference<Node> l_node(*this);
	reference<Node> r_node(other);
	auto pos = DConstants::INVALID_INDEX;

	if (l_node.get().GetType() == NType::PREFIX && r_node.get().GetType() == NType::PREFIX) {
		// Traverse prefixes. Possibly change the referenced nodes.
		if (!Prefix::Traverse(art, l_node, r_node, pos, status)) {
			return false;
		}
		if (pos == DConstants::INVALID_INDEX) {
			return true;
		}

	} else {
		// l_prefix contains r_prefix.
		if (l_node.get().GetType() == NType::PREFIX) {
			swap(*this, other);
		}
		pos = 0;
	}

	D_ASSERT(pos != DConstants::INVALID_INDEX);
	if (l_node.get().GetType() != NType::PREFIX && r_node.get().GetType() == NType::PREFIX) {
		return PrefixContainsOther(art, l_node, r_node, UnsafeNumericCast<uint8_t>(pos), status);
	}

	// The prefixes differ.
	MergeIntoNode4(art, l_node, r_node, UnsafeNumericCast<uint8_t>(pos));
	return true;
}